

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::outsmesh(tetgenmesh *this,char *smfilename)

{
  tetgenio *ptVar1;
  double *pdVar2;
  size_t sVar3;
  FILE *__stream;
  shellface *pppdVar4;
  bool bVar5;
  long lVar6;
  tetgenmesh *ptVar7;
  tetgenbehavior *ptVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  char smefilename [1024];
  char nodfilename [1024];
  
  if ((smfilename == (char *)0x0) || (*smfilename == '\0')) {
    ptVar8 = this->b;
    if (ptVar8->outfilename[0] == '\0') {
      builtin_strncpy(smefilename,"unnamed",8);
    }
    else {
      strcpy(smefilename,ptVar8->outfilename);
    }
  }
  else {
    strcpy(smefilename,smfilename);
    ptVar8 = this->b;
  }
  strcpy(nodfilename,smefilename);
  sVar3 = strlen(smefilename);
  builtin_strncpy(smefilename + sVar3,".smesh",7);
  sVar3 = strlen(nodfilename);
  builtin_strncpy(nodfilename + sVar3,".node",6);
  if (ptVar8->quiet == 0) {
    printf("Writing %s.\n",smefilename);
  }
  __stream = fopen(smefilename,"w");
  if (__stream == (FILE *)0x0) {
    printf("File I/O Error:  Cannot create file %s.\n",smefilename);
  }
  else {
    bVar5 = this->in->firstnumber == 1 && this->b->zeroindex != 0;
    fprintf(__stream,"# %s.  TetGen\'s input file.\n",smefilename);
    fwrite("\n# part 1: node list.\n",0x16,1,__stream);
    fprintf(__stream,"0  3  0  0  # nodes are found in %s.\n",nodfilename);
    uVar9 = 0;
    if (this->b->nobound == 0) {
      uVar9 = 1;
      if (this->in->facetmarkerlist == (int *)0x0) {
        uVar9 = (ulong)(this->in->trifacemarkerlist != (int *)0x0);
      }
    }
    fwrite("\n# part 2: facet list.\n",0x17,1,__stream);
    fprintf(__stream,"%ld  %d\n",this->subfaces->items,uVar9);
    ptVar7 = (tetgenmesh *)this->subfaces;
    memorypool::traversalinit((memorypool *)ptVar7);
    pppdVar4 = shellfacetraverse(ptVar7,this->subfaces);
    uVar11 = 0;
    while (pppdVar4 != (shellface *)0x0) {
      if ((char)uVar9 != '\0') {
        uVar11 = *(uint *)((long)pppdVar4 + (long)this->shmarkindex * 4);
      }
      lVar6 = (long)this->pointmarkindex;
      uVar12 = (uint)bVar5;
      fprintf(__stream,"3    %4d  %4d  %4d",
              (ulong)(*(int *)((long)pppdVar4[sorgpivot[0]] + lVar6 * 4) - uVar12),
              (ulong)(*(int *)((long)pppdVar4[sdestpivot[0]] + lVar6 * 4) - uVar12),
              (ulong)(*(int *)((long)pppdVar4[sapexpivot[0]] + lVar6 * 4) - (uint)bVar5));
      if ((char)uVar9 != '\0') {
        fprintf(__stream,"    %d",(ulong)uVar11);
      }
      ptVar7 = (tetgenmesh *)0xa;
      fputc(10,__stream);
      pppdVar4 = shellfacetraverse(ptVar7,this->subfaces);
    }
    fwrite("\n# part 3: hole list.\n",0x16,1,__stream);
    lVar10 = 0;
    fprintf(__stream,"%d\n",(ulong)(uint)this->in->numberofholes);
    lVar6 = 0x10;
    while( true ) {
      ptVar1 = this->in;
      if (ptVar1->numberofholes <= lVar10) break;
      pdVar2 = ptVar1->holelist;
      fprintf(__stream,"%d  %g  %g  %g\n",*(undefined8 *)((long)pdVar2 + lVar6 + -0x10),
              *(undefined8 *)((long)pdVar2 + lVar6 + -8),*(undefined8 *)((long)pdVar2 + lVar6),
              (ulong)(uint)(ptVar1->firstnumber + (int)lVar10));
      lVar10 = lVar10 + 1;
      lVar6 = lVar6 + 0x18;
    }
    fwrite("\n# part 4: region list.\n",0x18,1,__stream);
    lVar10 = 0;
    fprintf(__stream,"%d\n",(ulong)(uint)this->in->numberofregions);
    lVar6 = 0x20;
    while( true ) {
      ptVar1 = this->in;
      if (ptVar1->numberofregions <= lVar10) break;
      pdVar2 = ptVar1->regionlist;
      fprintf(__stream,"%d  %g  %g  %g  %d  %g\n",*(undefined8 *)((long)pdVar2 + lVar6 + -0x20),
              *(undefined8 *)((long)pdVar2 + lVar6 + -0x18),
              *(undefined8 *)((long)pdVar2 + lVar6 + -0x10),*(undefined8 *)((long)pdVar2 + lVar6),
              (ulong)(uint)(ptVar1->firstnumber + (int)lVar10),
              (ulong)(uint)(int)*(double *)((long)pdVar2 + lVar6 + -8));
      lVar10 = lVar10 + 1;
      lVar6 = lVar6 + 0x28;
    }
    fprintf(__stream,"# Generated by %s\n",this->b->commandline);
    fclose(__stream);
  }
  return;
}

Assistant:

void tetgenmesh::outsmesh(char* smfilename)
{
  FILE *outfile;
  char nodfilename[FILENAMESIZE];
  char smefilename[FILENAMESIZE];
  face faceloop;
  point p1, p2, p3;
  int firstindex, shift;
  int bmark;
  int marker;
  int i;

  if (smfilename != (char *) NULL && smfilename[0] != '\0') {
    strcpy(smefilename, smfilename);
  } else if (b->outfilename[0] != '\0') {
    strcpy(smefilename, b->outfilename);
  } else {
    strcpy(smefilename, "unnamed");
  }
  strcpy(nodfilename, smefilename);
  strcat(smefilename, ".smesh");
  strcat(nodfilename, ".node");

  if (!b->quiet) {
    printf("Writing %s.\n", smefilename);
  }
  outfile = fopen(smefilename, "w");
  if (outfile == (FILE *) NULL) {
    printf("File I/O Error:  Cannot create file %s.\n", smefilename);
    return;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  fprintf(outfile, "# %s.  TetGen's input file.\n", smefilename);
  fprintf(outfile, "\n# part 1: node list.\n");
  fprintf(outfile, "0  3  0  0  # nodes are found in %s.\n", nodfilename);

  marker = 0; // avoid compile warning.
  bmark = !b->nobound && (in->facetmarkerlist || in->trifacemarkerlist);  

  fprintf(outfile, "\n# part 2: facet list.\n");
  // Number of facets, boundary marker.
  fprintf(outfile, "%ld  %d\n", subfaces->items, bmark);
  
  subfaces->traversalinit();
  faceloop.sh = shellfacetraverse(subfaces);
  while (faceloop.sh != (shellface *) NULL) {
    p1 = sorg(faceloop);
    p2 = sdest(faceloop);
    p3 = sapex(faceloop);
    if (bmark) {
      marker = shellmark(faceloop);
    }
    fprintf(outfile, "3    %4d  %4d  %4d", pointmark(p1) - shift,
            pointmark(p2) - shift, pointmark(p3) - shift);
    if (bmark) {
      fprintf(outfile, "    %d", marker);
    }
    fprintf(outfile, "\n");
    faceloop.sh = shellfacetraverse(subfaces);
  }

  // Copy input holelist.
  fprintf(outfile, "\n# part 3: hole list.\n");
  fprintf(outfile, "%d\n", in->numberofholes);
  for (i = 0; i < in->numberofholes; i++) {
    fprintf(outfile, "%d  %g  %g  %g\n", i + in->firstnumber,
            in->holelist[i * 3], in->holelist[i * 3 + 1],
            in->holelist[i * 3 + 2]);
  }

  // Copy input regionlist.
  fprintf(outfile, "\n# part 4: region list.\n");
  fprintf(outfile, "%d\n", in->numberofregions);
  for (i = 0; i < in->numberofregions; i++) {
    fprintf(outfile, "%d  %g  %g  %g  %d  %g\n", i + in->firstnumber,
            in->regionlist[i * 5], in->regionlist[i * 5 + 1],
            in->regionlist[i * 5 + 2], (int) in->regionlist[i * 5 + 3],
            in->regionlist[i * 5 + 4]);
  }

  fprintf(outfile, "# Generated by %s\n", b->commandline);
  fclose(outfile);
}